

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

int rfind(char *string,char ch)

{
  size_t sVar1;
  bool bVar2;
  int local_18;
  int last;
  char ch_local;
  char *string_local;
  
  sVar1 = strlen(string);
  local_18 = (int)sVar1;
  do {
    local_18 = local_18 + -1;
    bVar2 = false;
    if (-1 < local_18) {
      bVar2 = string[local_18] != ch;
    }
  } while (bVar2);
  return local_18;
}

Assistant:

static int rfind(char *string, char ch) {
	int last = (int) strlen(string) - 1;
	while (last >= 0 && string[last] != ch) {
		last--;
	}
	return last;
}